

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  XIO_HANDLE xio;
  uchar done;
  XIO_HANDLE socketio;
  SOCKETIO_CONFIG socketio_config;
  IO_INTERFACE_DESCRIPTION *socketio_interface;
  int result;
  char **argv_local;
  int argc_local;
  
  iVar1 = platform_init();
  if (iVar1 == 0) {
    socketio_config.accepted_socket = socketio_get_interface_description();
    if ((IO_INTERFACE_DESCRIPTION *)socketio_config.accepted_socket ==
        (IO_INTERFACE_DESCRIPTION *)0x0) {
      printf("Error getting socketio interface description.");
      socketio_interface._4_4_ = 0x45;
    }
    else {
      socketio = (XIO_HANDLE)anon_var_dwarf_57;
      socketio_config.hostname._0_4_ = 0x50;
      xio = xio_create((IO_INTERFACE_DESCRIPTION *)socketio_config.accepted_socket,&socketio);
      if (xio == (XIO_HANDLE)0x0) {
        printf("Error creating socket IO.");
        socketio_interface._4_4_ = 0x52;
      }
      else {
        iVar1 = xio_open(xio,on_io_open_complete,xio,on_io_bytes_received,xio,on_io_error,xio);
        if (iVar1 == 0) {
          do {
            xio_dowork(xio);
          } while( true );
        }
        printf("Error opening socket IO.");
        socketio_interface._4_4_ = 0x59;
        xio_destroy(xio);
      }
    }
    platform_deinit();
  }
  else {
    printf("Cannot initialize platform.");
    socketio_interface._4_4_ = 0x3d;
  }
  return socketio_interface._4_4_;
}

Assistant:

int main(int argc, char** argv)
{
    int result;

    (void)argc, (void)argv;

    if (platform_init() != 0)
    {
        (void)printf("Cannot initialize platform.");
        result = MU_FAILURE;
    }
    else
    {
        const IO_INTERFACE_DESCRIPTION* socketio_interface = socketio_get_interface_description();
        if (socketio_interface == NULL)
        {
            (void)printf("Error getting socketio interface description.");
            result = MU_FAILURE;
        }
        else
        {
            SOCKETIO_CONFIG socketio_config;
            XIO_HANDLE socketio;

            socketio_config.hostname = "www.google.com";
            socketio_config.port = 80;
            socketio = xio_create(socketio_interface, &socketio_config);
            if (socketio == NULL)
            {
                (void)printf("Error creating socket IO.");
                result = MU_FAILURE;
            }
            else
            {
                if (xio_open(socketio, on_io_open_complete, socketio, on_io_bytes_received, socketio, on_io_error, socketio) != 0)
                {
                    (void)printf("Error opening socket IO.");
                    result = MU_FAILURE;
                }
                else
                {
                    unsigned char done = 0;
                    while (!done)
                    {
                        xio_dowork(socketio);
                    }

                    result = 0;
                }

                xio_destroy(socketio);
            }
        }

        platform_deinit();
    }

    return result;
}